

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void gpt_print_usage(int argc,char **argv,gpt_params *params)

{
  char *pcVar1;
  long in_RDX;
  undefined8 *in_RSI;
  FILE *__stream;
  
  fprintf(_stderr,"usage: %s [options]\n",*in_RSI);
  fprintf(_stderr,"\n");
  fprintf(_stderr,"options:\n");
  fprintf(_stderr,"  -h, --help            show this help message and exit\n");
  fprintf(_stderr,"  -i, --interactive     run in interactive mode\n");
  fprintf(_stderr,"  --interactive-start   run in interactive mode and poll user input at startup\n"
         );
  fprintf(_stderr,"  -r PROMPT, --reverse-prompt PROMPT\n");
  fprintf(_stderr,
          "                        in interactive mode, poll user input upon seeing PROMPT\n");
  fprintf(_stderr,
          "  --color               colorise output to distinguish prompt and user input from generations\n"
         );
  fprintf(_stderr,"  -s SEED, --seed SEED  RNG seed (default: -1)\n");
  fprintf(_stderr,
          "  -t N, --threads N     number of threads to use during computation (default: %d)\n",
          (ulong)*(uint *)(in_RDX + 4));
  fprintf(_stderr,"  -p PROMPT, --prompt PROMPT\n");
  fprintf(_stderr,"                        prompt to start generation with (default: random)\n");
  fprintf(_stderr,"  -f FNAME, --file FNAME\n");
  fprintf(_stderr,"                        prompt file to start generation.\n");
  fprintf(_stderr,"  -n N, --n_predict N   number of tokens to predict (default: %d)\n",
          (ulong)*(uint *)(in_RDX + 8));
  fprintf(_stderr,"  --top_k N             top-k sampling (default: %d)\n",
          (ulong)*(uint *)(in_RDX + 0x14));
  fprintf(_stderr,"  --top_p N             top-p sampling (default: %.1f)\n",
          (double)*(float *)(in_RDX + 0x18));
  fprintf(_stderr,"  --repeat_last_n N     last n tokens to consider for penalize (default: %d)\n",
          (ulong)*(uint *)(in_RDX + 0xc));
  fprintf(_stderr,"  --repeat_penalty N    penalize repeat sequence of tokens (default: %.1f)\n",
          (double)*(float *)(in_RDX + 0x20));
  fprintf(_stderr,"  -c N, --ctx_size N    size of the prompt context (default: %d)\n",
          (ulong)*(uint *)(in_RDX + 0x10));
  fprintf(_stderr,"  --temp N              temperature (default: %.1f)\n",
          (double)*(float *)(in_RDX + 0x1c));
  fprintf(_stderr,"  -b N, --batch_size N  batch size for prompt processing (default: %d)\n",
          (ulong)*(uint *)(in_RDX + 0x24));
  fprintf(_stderr,"  -m FNAME, --model FNAME\n");
  __stream = _stderr;
  pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_stderr);
  fprintf(__stream,"                        model path (default: %s)\n",pcVar1);
  fprintf(_stderr,"\n");
  return;
}

Assistant:

void gpt_print_usage(int argc, char ** argv, const gpt_params & params) {
    fprintf(stderr, "usage: %s [options]\n", argv[0]);
    fprintf(stderr, "\n");
    fprintf(stderr, "options:\n");
    fprintf(stderr, "  -h, --help            show this help message and exit\n");
    fprintf(stderr, "  -i, --interactive     run in interactive mode\n");
    fprintf(stderr, "  --interactive-start   run in interactive mode and poll user input at startup\n");
    fprintf(stderr, "  -r PROMPT, --reverse-prompt PROMPT\n");
    fprintf(stderr, "                        in interactive mode, poll user input upon seeing PROMPT\n");
    fprintf(stderr, "  --color               colorise output to distinguish prompt and user input from generations\n");
    fprintf(stderr, "  -s SEED, --seed SEED  RNG seed (default: -1)\n");
    fprintf(stderr, "  -t N, --threads N     number of threads to use during computation (default: %d)\n", params.n_threads);
    fprintf(stderr, "  -p PROMPT, --prompt PROMPT\n");
    fprintf(stderr, "                        prompt to start generation with (default: random)\n");
    fprintf(stderr, "  -f FNAME, --file FNAME\n");
    fprintf(stderr, "                        prompt file to start generation.\n");
    fprintf(stderr, "  -n N, --n_predict N   number of tokens to predict (default: %d)\n", params.n_predict);
    fprintf(stderr, "  --top_k N             top-k sampling (default: %d)\n", params.top_k);
    fprintf(stderr, "  --top_p N             top-p sampling (default: %.1f)\n", params.top_p);
    fprintf(stderr, "  --repeat_last_n N     last n tokens to consider for penalize (default: %d)\n", params.repeat_last_n);
    fprintf(stderr, "  --repeat_penalty N    penalize repeat sequence of tokens (default: %.1f)\n", params.repeat_penalty);
    fprintf(stderr, "  -c N, --ctx_size N    size of the prompt context (default: %d)\n", params.n_ctx);
    fprintf(stderr, "  --temp N              temperature (default: %.1f)\n", params.temp);
    fprintf(stderr, "  -b N, --batch_size N  batch size for prompt processing (default: %d)\n", params.n_batch);
    fprintf(stderr, "  -m FNAME, --model FNAME\n");
    fprintf(stderr, "                        model path (default: %s)\n", params.model.c_str());
    fprintf(stderr, "\n");
}